

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastMtR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  EpsCopyInputStream *table_00;
  ErrnoSaver EVar4;
  bool bVar5;
  uint uVar6;
  EpsCopyInputStream *field;
  MessageLite *pMVar8;
  ulong uVar9;
  int iVar7;
  EpsCopyInputStream *pEVar10;
  char *pcVar11;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  TcParseTableBase *unaff_RBX;
  int iVar13;
  long v1;
  EpsCopyInputStream *ptr_00;
  uint *puVar14;
  pair<const_char_*,_int> pVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  EpsCopyInputStream *local_70 [2];
  char *local_60;
  MessageLite *local_58;
  
  if (data.field_0._0_2_ != 0) {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  field = (EpsCopyInputStream *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)field & 7) != 0) {
    AlignFail(field);
  }
  uVar2 = *(ushort *)ptr;
  table_00 = *(EpsCopyInputStream **)
              ((long)&table->has_bits_offset +
              ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  local_60 = (char *)hasbits;
  local_58 = msg;
  do {
    ptr_00 = field;
    pMVar8 = AddMessage((TcParseTableBase *)table_00,(RepeatedPtrFieldBase *)field);
    bVar1 = *(byte *)((long)&((EpsCopyInputStream *)ptr)->limit_end_ + 2);
    aVar12.data._1_7_ = 0;
    aVar12.data._0_1_ = bVar1;
    if ((char)bVar1 < '\0') {
      ptr_00 = (EpsCopyInputStream *)(ulong)(uint)bVar1;
      pVar15 = ReadSizeFallback((char *)((long)&((EpsCopyInputStream *)ptr)->limit_end_ + 2),
                                (uint)bVar1);
      auVar16._8_8_ = pVar15._8_8_;
      auVar16._0_8_ = local_70[0];
      if (pVar15.first == (char *)0x0) goto LAB_00436b3f;
      aVar12.data = pVar15._8_8_ & 0xffffffff;
    }
    else {
      pVar15._8_8_ = extraout_RDX;
      pVar15.first = (char *)((long)&((EpsCopyInputStream *)ptr)->limit_end_ + 3);
    }
    auVar16._8_8_ = pVar15._8_8_;
    auVar16._0_8_ = local_70[0];
    if (ctx->depth_ < 1) goto LAB_00436b3f;
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_70,(char *)ctx,(int)pVar15.first);
    EVar4.saved_errno_ = local_70[0]._0_4_;
    v1 = (long)ctx->depth_ + -1;
    iVar13 = (int)v1;
    ctx->depth_ = iVar13;
    local_70[0] = (EpsCopyInputStream *)pVar15.first;
    while( true ) {
      ptr_00 = (EpsCopyInputStream *)local_70;
      bVar5 = EpsCopyInputStream::DoneWithCheck<false>
                        (&ctx->super_EpsCopyInputStream,(char **)local_70,ctx->group_depth_);
      auVar16._8_8_ = extraout_RDX_00;
      auVar16._0_8_ = local_70[0];
      if (bVar5) break;
      uVar6 = (uint)*(byte *)&table_00->buffer_end_ & (uint)*(ushort *)&local_70[0]->limit_end_;
      if ((uVar6 & 7) != 0) goto LAB_00436c2f;
      uVar9 = (ulong)(uVar6 & 0xfffffff8);
      aVar12.data = (ulong)*(ushort *)&local_70[0]->limit_end_ ^
                    *(ulong *)(table_00->patch_buffer_ + uVar9 * 2 + 0x18);
      auVar16 = (**(code **)(table_00->patch_buffer_ + uVar9 * 2 + 0x10))
                          (pMVar8,local_70[0],ctx,aVar12.data,table_00,0);
      ptr_00 = local_70[0];
      if ((auVar16._0_8_ == (EpsCopyInputStream *)0x0) ||
         (local_70[0] = auVar16._0_8_, (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
      break;
    }
    local_70[0] = auVar16._0_8_;
    if (((ulong)table_00->buffer_end_ & 0x100) == 0) {
      if (local_70[0] == (EpsCopyInputStream *)0x0) {
        ptr_00 = table_00;
        VerifyHasBitConsistency((MessageLite *)table,unaff_RBX);
        auVar17._8_8_ = extraout_RDX_01;
        auVar17._0_8_ = local_70[0];
        goto LAB_00436b27;
      }
      iVar7 = ctx->depth_;
      ptr = (char *)local_70[0];
LAB_00436aac:
      local_70[0] = auVar16._0_8_;
      if (iVar13 != iVar7) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (v1,(long)iVar7,"old_depth == depth_");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_70,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,0x481,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_70);
      }
      aVar12.data = 0;
    }
    else {
      ptr_00 = local_70[0];
      auVar17 = (**(code **)table_00->patch_buffer_)(pMVar8,local_70[0],ctx);
LAB_00436b27:
      ptr = auVar17._0_8_;
      auVar16._8_8_ = auVar17._8_8_;
      auVar16._0_8_ = local_70[0];
      iVar7 = ctx->depth_;
      if ((EpsCopyInputStream *)ptr != (EpsCopyInputStream *)0x0) goto LAB_00436aac;
      aVar12.data._1_7_ = (undefined7)((ulong)aVar12 >> 8);
      aVar12.data._0_1_ = 1;
      ptr = (char *)0x0;
    }
    local_70[0] = auVar16._0_8_;
    ctx->depth_ = iVar7 + 1;
    uVar6 = EVar4.saved_errno_ + (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar6;
    if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) {
LAB_00436b3f:
      local_70[0] = auVar16._0_8_;
      pcVar11 = Error(local_58,(char *)ptr_00,auVar16._8_8_,(TcFieldData)aVar12,table,
                      (uint64_t)local_60);
      return pcVar11;
    }
    pEVar10 = (EpsCopyInputStream *)
              ((ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar6 >> 0x1f & uVar6));
    (ctx->super_EpsCopyInputStream).limit_end_ = (char *)pEVar10;
    if ((char)aVar12.data != '\0') goto LAB_00436b3f;
    if (pEVar10 <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar14 = (uint *)((long)&local_58->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar14 & 3) != 0) {
          AlignFail();
        }
        *puVar14 = *puVar14 | (uint)local_60;
      }
      return (char *)(EpsCopyInputStream *)ptr;
    }
    uVar3 = *(ushort *)&((EpsCopyInputStream *)ptr)->limit_end_;
    if (uVar3 != uVar2) {
      uVar6 = (uint)table->fast_idx_mask & (uint)uVar3;
      if ((uVar6 & 7) == 0) {
        uVar9 = (ulong)(uVar6 & 0xfffffff8);
        pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar9))
                                    (local_58,ptr,ctx,
                                     (ulong)uVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2),
                                     table,local_60);
        return pcVar11;
      }
LAB_00436c2f:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}